

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderTextureFunctionTests.cpp
# Opt level: O0

void deqp::gles3::Functional::evalTexelFetch2DArray(ShaderEvalContext *c,TexLookupParams *p)

{
  deInt32 dVar1;
  int iVar2;
  float *pfVar3;
  ConstPixelBufferAccess *pCVar4;
  undefined1 local_58 [16];
  Vector<float,_4> local_48;
  void *local_38;
  undefined8 local_30;
  deInt32 local_28;
  deInt32 local_24;
  int lod;
  int l;
  int y;
  int x;
  TexLookupParams *p_local;
  ShaderEvalContext *c_local;
  
  _y = p;
  p_local = (TexLookupParams *)c;
  pfVar3 = tcu::Vector<float,_4>::x(c->in);
  dVar1 = deChopFloatToInt32(*pfVar3);
  iVar2 = tcu::Vector<int,_3>::x(&_y->offset);
  l = dVar1 + iVar2;
  pfVar3 = tcu::Vector<float,_4>::y((Vector<float,_4> *)(p_local + 1));
  dVar1 = deChopFloatToInt32(*pfVar3);
  iVar2 = tcu::Vector<int,_3>::y(&_y->offset);
  lod = dVar1 + iVar2;
  pfVar3 = tcu::Vector<float,_4>::z((Vector<float,_4> *)(p_local + 1));
  local_24 = deChopFloatToInt32(*pfVar3);
  pfVar3 = tcu::Vector<float,_4>::x(&p_local[1].scale);
  local_28 = deChopFloatToInt32(*pfVar3);
  pCVar4 = tcu::TextureLevelPyramid::getLevel(*(TextureLevelPyramid **)(p_local + 4),local_28);
  tcu::ConstPixelBufferAccess::getPixel((ConstPixelBufferAccess *)local_58,(int)pCVar4,l,lod);
  tcu::operator*((tcu *)&local_48,(Vector<float,_4> *)local_58,&_y->scale);
  tcu::operator+((tcu *)&local_38,&local_48,&_y->bias);
  *(void **)p_local[10].scale.m_data = local_38;
  *(undefined8 *)(p_local[10].scale.m_data + 2) = local_30;
  return;
}

Assistant:

static void evalTexelFetch2DArray (gls::ShaderEvalContext& c, const TexLookupParams& p)
{
	int	x	= deChopFloatToInt32(c.in[0].x())+p.offset.x();
	int	y	= deChopFloatToInt32(c.in[0].y())+p.offset.y();
	int	l	= deChopFloatToInt32(c.in[0].z());
	int	lod = deChopFloatToInt32(c.in[1].x());
	c.color = c.textures[0].tex2DArray->getLevel(lod).getPixel(x, y, l)*p.scale + p.bias;
}